

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestToStringVisitor.cpp
# Opt level: O3

void anon_unknown.dwarf_1aadc0::_DOCTEST_ANON_FUNC_34(void)

{
  ostringstream *this;
  _DOCTEST_ANON_CLASS_33 v;
  undefined1 local_5d8 [392];
  OstreamBuffer local_450;
  ToStringVisitor local_40;
  
  this = (ostringstream *)(local_5d8 + 0x10);
  local_5d8._0_8_ = (char *)0x0;
  local_5d8._8_8_ = (char *)0x0;
  std::__cxx11::ostringstream::ostringstream(this);
  binlog::detail::OstreamBuffer::OstreamBuffer(&local_450,(ostream *)this);
  binlog::ToStringVisitor::ToStringVisitor(&local_40,&local_450,(PrettyPrinter *)0x0);
  _DOCTEST_ANON_CLASS_33::f((_DOCTEST_ANON_CLASS_33 *)local_5d8);
  binlog::detail::OstreamBuffer::~OstreamBuffer(&local_450);
  std::__cxx11::ostringstream::~ostringstream(this);
  std::ios_base::~ios_base((ios_base *)(local_5d8 + 0x80));
  return;
}

Assistant:

std::string result()
  {
    buf.flush();
    return str.str();
  }